

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase583::TestCase583(TestCase583 *this)

{
  TestCase583 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                     ,0x247,"legacy test: Async/ForkMaybeRef");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bef130;
  return;
}

Assistant:

TEST(Async, ForkMaybeRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Maybe<Own<RefcountedInt>>> promise = evalLater([&]() {
    return Maybe<Own<RefcountedInt>>(refcounted<RefcountedInt>(123));
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}